

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O2

int Fraig_ManCheckMiter(Fraig_Man_t *p)

{
  uint uVar1;
  Fraig_Node_t *pNode;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (p->pModel != (int *)0x0) {
    free(p->pModel);
    p->pModel = (int *)0x0;
  }
  uVar1 = p->vOutputs->nSize;
  uVar5 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar5;
  }
  do {
    if (uVar4 == uVar5) {
      return 1;
    }
    pNode = p->vOutputs->pArray[uVar5];
    uVar5 = uVar5 + 1;
  } while (pNode == (Fraig_Node_t *)((ulong)p->pConst1 ^ 1));
  if (pNode == p->pConst1) {
    piVar3 = Fraig_ManAllocCounterExample(p);
    p->pModel = piVar3;
    iVar2 = 0;
  }
  else {
    piVar3 = Fraig_ManSaveCounterExample(p,pNode);
    p->pModel = piVar3;
    iVar2 = -(uint)(piVar3 == (int *)0x0);
  }
  return iVar2;
}

Assistant:

int Fraig_ManCheckMiter( Fraig_Man_t * p )
{
    Fraig_Node_t * pNode;
    int i;
    ABC_FREE( p->pModel );
    for ( i = 0; i < p->vOutputs->nSize; i++ )
    {
        // get the output node (it can be complemented!)
        pNode = p->vOutputs->pArray[i];
        // if the miter is constant 0, the problem is UNSAT
        if ( pNode == Fraig_Not(p->pConst1) )
            continue;
        // consider the special case when the miter is constant 1
        if ( pNode == p->pConst1 )
        {
            // in this case, any counter example will do to distinquish it from constant 0
            // here we pick the counter example composed of all zeros
            p->pModel = Fraig_ManAllocCounterExample( p );
            return 0;
        }
        // save the counter example
        p->pModel = Fraig_ManSaveCounterExample( p, pNode );
        // if the model is not found, return undecided
        if ( p->pModel == NULL )
            return -1;
        else
            return 0;
    }
    return 1;
}